

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

int prvTidyDocParseStream(TidyDocImpl *doc,StreamIn *in)

{
  int iVar1;
  TidyConfigChangeCallback p_Var2;
  int iVar3;
  Bool BVar4;
  uint uVar5;
  Lexer *pLVar6;
  
  iVar1 = *(int *)((doc->config).value + 0x67);
  p_Var2 = doc->pConfigChangeCallback;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if ((doc != (TidyDocImpl *)0x0) && (in != (StreamIn *)0x0)) {
    if (doc->docIn == (StreamIn *)0x0) {
      doc->docIn = in;
      prvTidyResetTags(doc);
      prvTidyTakeConfigSnapshot(doc);
      prvTidyAdjustConfig(doc);
      prvTidyFreeAnchors(doc);
      prvTidyFreeNode(doc,&doc->root);
      (doc->root).closed = no;
      (doc->root).implicit = no;
      *(undefined8 *)&(doc->root).linebreak = 0;
      (doc->root).type = RootNode;
      (doc->root).line = 0;
      (doc->root).column = 0;
      (doc->root).idx = 0;
      (doc->root).element = (tmbstr)0x0;
      (doc->root).start = 0;
      (doc->root).end = 0;
      (doc->root).was = (Dict *)0x0;
      (doc->root).tag = (Dict *)0x0;
      (doc->root).last = (Node *)0x0;
      (doc->root).attributes = (AttVal *)0x0;
      (doc->root).next = (Node *)0x0;
      (doc->root).content = (Node *)0x0;
      (doc->root).parent = (Node *)0x0;
      (doc->root).prev = (Node *)0x0;
      if (doc->givenDoctype != (tmbstr)0x0) {
        (*doc->allocator->vtbl->free)(doc->allocator,doc->givenDoctype);
      }
      prvTidyFreeLexer(doc);
      doc->givenDoctype = (tmbstr)0x0;
      pLVar6 = prvTidyNewLexer(doc);
      doc->lexer = pLVar6;
      (doc->root).line = pLVar6->lines;
      (doc->root).column = pLVar6->columns;
      doc->inputHadBOM = no;
      doc->xmlDetected = no;
      iVar3 = prvTidyReadBOMEncoding(in);
      if (iVar3 != -1) {
        in->encoding = iVar3;
        prvTidySetOptionInt(doc,TidyInCharEncoding,(long)iVar3);
      }
      if (iVar1 == 0) {
        doc->warnings = 0;
        prvTidyParseDocument(doc);
      }
      else {
        prvTidyParseXMLDocument(doc);
      }
      BVar4 = prvTidyCheckNodeIntegrity(&doc->root);
      if (BVar4 == no) {
        (*doc->allocator->vtbl->panic)(doc->allocator,"\nPanic - tree has lost its integrity\n");
      }
      doc->docIn = (StreamIn *)0x0;
      doc->pConfigChangeCallback = p_Var2;
      uVar5 = 2;
      if ((doc->errors == 0) && (uVar5 = 1, doc->warnings == 0)) {
        uVar5 = (uint)(doc->accessErrors != 0);
      }
      return uVar5;
    }
    __assert_fail("doc->docIn == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/tidylib.c"
                  ,0x5b8,"int prvTidyDocParseStream(TidyDocImpl *, StreamIn *)");
  }
  __assert_fail("doc != NULL && in != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/tidylib.c"
                ,0x5b7,"int prvTidyDocParseStream(TidyDocImpl *, StreamIn *)");
}

Assistant:

int         TY_(DocParseStream)( TidyDocImpl* doc, StreamIn* in )
{
    Bool xmlIn = cfgBool( doc, TidyXmlTags );
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    
    int bomEnc;
    doc->pConfigChangeCallback = NULL;

    assert( doc != NULL && in != NULL );
    assert( doc->docIn == NULL );
    doc->docIn = in;

    TY_(ResetTags)(doc);             /* Reset table to html5 mode */
    TY_(TakeConfigSnapshot)( doc );  /* Save config state */
    TY_(AdjustConfig)( doc );        /* Ensure config internal consistency */
    TY_(FreeAnchors)( doc );

    TY_(FreeNode)(doc, &doc->root);
    TidyClearMemory(&doc->root, sizeof(Node));

    if (doc->givenDoctype)
        TidyDocFree(doc, doc->givenDoctype);
    /*\ 
     *  Issue #186 - Now FreeNode depend on the doctype, so the lexer is needed
     *  to determine which hash is to be used, so free it last.
    \*/
    TY_(FreeLexer)( doc );
    doc->givenDoctype = NULL;

    doc->lexer = TY_(NewLexer)( doc );
    /* doc->lexer->root = &doc->root; */
    doc->root.line = doc->lexer->lines;
    doc->root.column = doc->lexer->columns;
    doc->inputHadBOM = no;
    doc->xmlDetected = no;

    bomEnc = TY_(ReadBOMEncoding)(in);

    if (bomEnc != -1)
    {
        in->encoding = bomEnc;
        TY_(SetOptionInt)(doc, TidyInCharEncoding, bomEnc);
    }

    /* Tidy doesn't alter the doctype for generic XML docs */
    if ( xmlIn )
    {
        TY_(ParseXMLDocument)( doc );
        if ( !TY_(CheckNodeIntegrity)( &doc->root ) )
            TidyPanic( doc->allocator, integrity );
    }
    else
    {
        doc->warnings = 0;
        TY_(ParseDocument)( doc );
        if ( !TY_(CheckNodeIntegrity)( &doc->root ) )
            TidyPanic( doc->allocator, integrity );
    }

    doc->docIn = NULL;
    doc->pConfigChangeCallback = callback;

    return tidyDocStatus( doc );
}